

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat Eye(int n)

{
  void *__s;
  ulong uVar1;
  double *in_RDX;
  double *extraout_RDX;
  uint in_ESI;
  undefined4 in_register_0000003c;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  Mat MVar5;
  
  puVar2 = (uint *)CONCAT44(in_register_0000003c,n);
  *puVar2 = in_ESI;
  puVar2[1] = in_ESI;
  if (in_ESI == 0) {
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  else {
    uVar1 = (ulong)in_ESI;
    uVar4 = in_ESI * in_ESI;
    __s = operator_new__((ulong)uVar4 * 8);
    *(void **)(puVar2 + 2) = __s;
    iVar3 = 0;
    memset(__s,0,(ulong)(uVar4 + (uVar4 == 0)) << 3);
    in_RDX = extraout_RDX;
    if (0 < (int)in_ESI) {
      do {
        *(undefined8 *)((long)__s + (long)iVar3 * 8) = 0x3ff0000000000000;
        iVar3 = iVar3 + in_ESI + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  MVar5.v_ = in_RDX;
  MVar5._0_8_ = puVar2;
  return MVar5;
}

Assistant:

Mat Eye(const int n)
{
	Mat eyeMat(n, n);
	for (int j=0; j<n*n; j++)
		eyeMat.v_[j] = 0.0;
	for (int i=0; i<n; i++)
		eyeMat.v_[i*n + i] = 1.0;
	return eyeMat;
}